

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall
HEkk::chooseSimplexStrategyThreads(HEkk *this,HighsOptions *options,HighsSimplexInfo *info)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t __n;
  int iVar4;
  uint uVar5;
  long *plVar6;
  bool bVar7;
  
  iVar4 = (options->super_HighsOptionsStruct).simplex_strategy;
  info->simplex_strategy = iVar4;
  if (iVar4 == 0) {
    info->simplex_strategy = (uint)(info->num_primal_infeasibilities < 1) * 3 + 1;
  }
  info->min_concurrency = 1;
  info->max_concurrency = 1;
  uVar1 = (options->super_HighsOptionsStruct).simplex_min_concurrency;
  uVar2 = (options->super_HighsOptionsStruct).simplex_max_concurrency;
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  plVar6 = (long *)__tls_get_addr(&PTR_00449ef0);
  uVar3 = *(uint *)(*plVar6 + 0x28);
  __n = (options->super_HighsOptionsStruct).parallel._M_string_length;
  if (((__n == ::kHighsOnString_abi_cxx11_._M_string_length) &&
      (((__n == 0 ||
        (iVar4 = bcmp((options->super_HighsOptionsStruct).parallel._M_dataplus._M_p,
                      ::kHighsOnString_abi_cxx11_._M_dataplus._M_p,__n), iVar4 == 0)) &&
       (0 < (int)uVar3)))) && (info->simplex_strategy == 1)) {
    info->simplex_strategy = 3;
  }
  if (info->simplex_strategy == 3) {
    bVar7 = SBORROW4(uVar1,2);
    iVar4 = -2;
    uVar5 = 1;
  }
  else {
    if (info->simplex_strategy != 2) goto LAB_003427a4;
    bVar7 = SBORROW4(uVar1,4);
    iVar4 = -4;
    uVar5 = 3;
  }
  if (bVar7 == (int)(uVar1 + iVar4) < 0) {
    uVar5 = uVar1;
  }
  info->min_concurrency = uVar5;
  if ((int)uVar5 <= (int)uVar2) {
    uVar5 = uVar2;
  }
  info->max_concurrency = uVar5;
LAB_003427a4:
  uVar5 = info->max_concurrency;
  info->num_concurrency = uVar5;
  if ((int)uVar5 < (int)uVar1) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                 "Using concurrency of %d for parallel strategy rather than minimum number (%d) specified in options\n"
                 ,(ulong)uVar5,(ulong)uVar1);
  }
  if ((int)uVar2 < info->num_concurrency) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                 "Using concurrency of %d for parallel strategy rather than maximum number (%d) specified in options\n"
                 ,(ulong)(uint)info->num_concurrency,(ulong)uVar2);
  }
  if (info->num_concurrency <= (int)uVar3) {
    return;
  }
  highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
               "Number of threads available = %d < %d = Simplex concurrency to be used: Parallel performance may be less than anticipated\n"
               ,(ulong)uVar3);
  return;
}

Assistant:

void HEkk::chooseSimplexStrategyThreads(const HighsOptions& options,
                                        HighsSimplexInfo& info) {
  // Ensure that this is not called with an optimal basis
  assert(info.num_dual_infeasibilities > 0 ||
         info.num_primal_infeasibilities > 0);
  // Set the internal simplex strategy and number of threads for dual
  // simplex
  HighsInt& simplex_strategy = info.simplex_strategy;
  // By default, use the HighsOptions strategy. If this is
  // kSimplexStrategyChoose, then the strategy used will depend on
  // whether the current basis is primal feasible.
  simplex_strategy = options.simplex_strategy;
  if (simplex_strategy == kSimplexStrategyChoose) {
    // HiGHS is left to choose the simplex strategy
    if (info.num_primal_infeasibilities > 0) {
      // Not primal feasible, so use dual simplex
      simplex_strategy = kSimplexStrategyDual;
    } else {
      // Primal feasible. so use primal simplex
      simplex_strategy = kSimplexStrategyPrimal;
    }
  }
  // Set min/max_threads to correspond to serial code. They will be
  // set to other values if parallel options are used.
  info.min_concurrency = 1;
  info.max_concurrency = 1;
  // Record the min/max minimum concurrency in the options
  const HighsInt simplex_min_concurrency = options.simplex_min_concurrency;
  const HighsInt simplex_max_concurrency = options.simplex_max_concurrency;
  HighsInt max_threads = highs::parallel::num_threads();

  if (options.parallel == kHighsOnString &&
      simplex_strategy == kSimplexStrategyDual) {
    // The parallel strategy is on and the simplex strategy is dual so use
    // PAMI if there are enough threads
    if (max_threads >= kDualMultiMinConcurrency)
      simplex_strategy = kSimplexStrategyDualMulti;
  }
  //
  // If parallel strategies are used, the minimum concurrency will be
  // set to be at least the minimum required for the strategy
  //
  // All this is independent of the number of threads available, since
  // code with multiple concurrency can be run in serial.

  if (simplex_strategy == kSimplexStrategyDualTasks) {
    info.min_concurrency =
        max(kDualTasksMinConcurrency, simplex_min_concurrency);
    info.max_concurrency = max(info.min_concurrency, simplex_max_concurrency);
  } else if (simplex_strategy == kSimplexStrategyDualMulti) {
    info.min_concurrency =
        max(kDualMultiMinConcurrency, simplex_min_concurrency);
    info.max_concurrency = max(info.min_concurrency, simplex_max_concurrency);
  }

  // Set the concurrency to be used to be the maximum number
  info.num_concurrency = info.max_concurrency;
  // Give a warning if the concurrency to be used is less than the
  // minimum concurrency allowed
  if (info.num_concurrency < simplex_min_concurrency) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Using concurrency of %" HIGHSINT_FORMAT
                 " for parallel strategy rather than "
                 "minimum number (%" HIGHSINT_FORMAT ") specified in options\n",
                 info.num_concurrency, simplex_min_concurrency);
  }
  // Give a warning if the concurrency to be used is more than the
  // maximum concurrency allowed
  if (info.num_concurrency > simplex_max_concurrency) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Using concurrency of %" HIGHSINT_FORMAT
                 " for parallel strategy rather than "
                 "maximum number (%" HIGHSINT_FORMAT ") specified in options\n",
                 info.num_concurrency, simplex_max_concurrency);
  }
  // Give a warning if the concurrency to be used is less than the
  // number of threads available
  if (info.num_concurrency > max_threads) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Number of threads available = %" HIGHSINT_FORMAT
                 " < %" HIGHSINT_FORMAT
                 " = Simplex concurrency to be used: Parallel performance may "
                 "be less than anticipated\n",
                 max_threads, info.num_concurrency);
  }
}